

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_maximum_name_length(void)

{
  int iVar1;
  size_t sVar2;
  int tmp;
  int maxlen;
  int N;
  int i;
  int local_c;
  int local_4;
  
  iVar1 = xc_number_of_functionals();
  local_c = 0;
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    sVar2 = strlen(xc_functional_keys[local_4].name);
    if (local_c < (int)sVar2) {
      local_c = (int)sVar2;
    }
  }
  return local_c;
}

Assistant:

int xc_maximum_name_length(void)
{
  int i, N, maxlen, tmp;

  N=xc_number_of_functionals();

  maxlen=0;
  for(i=0;i<N;i++){
    tmp=strlen(xc_functional_keys[i].name);
    if(tmp > maxlen) maxlen=tmp;
  }

  return maxlen;
}